

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O0

bool __thiscall irr::video::COpenGLSLMaterialRenderer::linkProgram(COpenGLSLMaterialRenderer *this)

{
  GLenum *in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  GLint size_1;
  SUniformInfo ui_1;
  int i_1;
  c8 *buf_1;
  GLint maxlen_1;
  GLint num_1;
  GLcharARB *infoLog_1;
  GLsizei length_1;
  GLint maxLength_1;
  GLint status_1;
  GLint size;
  SUniformInfo ui;
  GLint i;
  c8 *buf;
  GLint maxlen;
  GLint num;
  GLchar *infoLog;
  GLsizei length;
  GLint maxLength;
  GLint status;
  GLchar *in_stack_fffffffffffffef8;
  GLuint program;
  SUniformInfo *pSVar1;
  COpenGLExtensionHandler *in_stack_ffffffffffffff00;
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *paVar2;
  GLenum in_stack_ffffffffffffff08;
  u32 in_stack_ffffffffffffff0c;
  COpenGLExtensionHandler *in_stack_ffffffffffffff10;
  string<char> *in_stack_ffffffffffffff18;
  COpenGLExtensionHandler *in_stack_ffffffffffffff20;
  GLchar *in_stack_ffffffffffffff38;
  undefined1 auStack_a0 [44];
  int local_74;
  int local_70;
  undefined1 auStack_48 [48];
  int local_18;
  int local_14;
  
  program = (GLuint)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  if (in_RDI[10] == 0) {
    COpenGLExtensionHandler::extGlLinkProgramARB(in_stack_ffffffffffffff00,program);
    local_70 = 0;
    COpenGLExtensionHandler::extGlGetObjectParameteriv
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
               (GLint *)in_stack_ffffffffffffff00);
    if (local_70 == 0) {
      os::Printer::log((Printer *)"GLSL shader program failed to link",__x_02);
      local_74 = 0;
      COpenGLExtensionHandler::extGlGetObjectParameteriv
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                 (GLint *)in_stack_ffffffffffffff00);
      if (local_74 != 0) {
        auStack_a0._32_8_ = operator_new__((long)local_74);
        COpenGLExtensionHandler::extGlGetInfoLog
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                   (GLsizei *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        os::Printer::log((Printer *)auStack_a0._32_8_,__x_03);
        if ((Printer *)auStack_a0._32_8_ != (Printer *)0x0) {
          operator_delete__((void *)auStack_a0._32_8_);
        }
      }
      return false;
    }
    auStack_a0._28_4_ = 0;
    COpenGLExtensionHandler::extGlGetObjectParameteriv
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
               (GLint *)in_stack_ffffffffffffff00);
    if (auStack_a0._28_4_ == 0) {
      return true;
    }
    auStack_a0._24_4_ = 0;
    COpenGLExtensionHandler::extGlGetObjectParameteriv
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
               (GLint *)in_stack_ffffffffffffff00);
    if (auStack_a0._24_4_ == 0) {
      os::Printer::log((Printer *)"GLSL: failed to retrieve uniform information",__x_04);
      return false;
    }
    auStack_a0._24_4_ = auStack_a0._24_4_ + 1;
    auStack_a0._16_8_ = operator_new__((long)(int)auStack_a0._24_4_);
    core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::clear
              ((array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)
               in_stack_ffffffffffffff10);
    core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::reallocate
              ((array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               SUB41(in_stack_ffffffffffffff08 >> 0x18,0));
    for (auStack_a0._12_4_ = 0; (int)auStack_a0._12_4_ < (int)auStack_a0._28_4_;
        auStack_a0._12_4_ = auStack_a0._12_4_ + 1) {
      SUniformInfo::SUniformInfo((SUniformInfo *)0x352584);
      memset((void *)auStack_a0._16_8_,0,(long)(int)auStack_a0._24_4_);
      pSVar1 = (SUniformInfo *)auStack_a0;
      paVar2 = (array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)auStack_a0._16_8_;
      COpenGLExtensionHandler::extGlGetActiveUniformARB
                (in_stack_ffffffffffffff20,(GLhandleARB)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (GLuint)in_stack_ffffffffffffff18,
                 (GLsizei)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                 (GLsizei *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (GLint *)auStack_a0._16_8_,in_RDI,in_stack_ffffffffffffff38);
      core::string<char>::operator=
                (in_stack_ffffffffffffff18,&in_stack_ffffffffffffff10->StencilBuffer);
      auStack_a0._4_4_ =
           COpenGLExtensionHandler::extGlGetUniformLocationARB
                     ((COpenGLExtensionHandler *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (GLhandleARB)((ulong)paVar2 >> 0x20),(char *)pSVar1);
      core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::push_back(paVar2,pSVar1);
      SUniformInfo::~SUniformInfo((SUniformInfo *)0x352627);
    }
    if ((array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)auStack_a0._16_8_ !=
        (array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)0x0) {
      operator_delete__((void *)auStack_a0._16_8_);
    }
  }
  else {
    COpenGLExtensionHandler::extGlLinkProgram(in_stack_ffffffffffffff00,program);
    local_14 = 0;
    COpenGLExtensionHandler::extGlGetProgramiv
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
               (GLint *)in_stack_ffffffffffffff00);
    if (local_14 == 0) {
      os::Printer::log((Printer *)"GLSL (> 2.x) shader program failed to link",__x);
      local_18 = 0;
      COpenGLExtensionHandler::extGlGetProgramiv
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                 (GLint *)in_stack_ffffffffffffff00);
      if (local_18 != 0) {
        auStack_48._32_8_ = operator_new__((long)local_18);
        COpenGLExtensionHandler::extGlGetProgramInfoLog
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                   (GLsizei *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        os::Printer::log((Printer *)auStack_48._32_8_,__x_00);
        if ((Printer *)auStack_48._32_8_ != (Printer *)0x0) {
          operator_delete__((void *)auStack_48._32_8_);
        }
      }
      return false;
    }
    auStack_48._28_4_ = 0;
    COpenGLExtensionHandler::extGlGetProgramiv
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
               (GLint *)in_stack_ffffffffffffff00);
    if (auStack_48._28_4_ == 0) {
      return true;
    }
    auStack_48._24_4_ = 0;
    COpenGLExtensionHandler::extGlGetProgramiv
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
               (GLint *)in_stack_ffffffffffffff00);
    if (auStack_48._24_4_ == 0) {
      os::Printer::log((Printer *)"GLSL (> 2.x): failed to retrieve uniform information",__x_01);
      return false;
    }
    auStack_48._24_4_ = auStack_48._24_4_ + 1;
    auStack_48._16_8_ = operator_new__((long)(int)auStack_48._24_4_);
    core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::clear
              ((array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)
               in_stack_ffffffffffffff10);
    core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::reallocate
              ((array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               SUB41(in_stack_ffffffffffffff08 >> 0x18,0));
    for (auStack_48._12_4_ = 0; (int)auStack_48._12_4_ < (int)auStack_48._28_4_;
        auStack_48._12_4_ = auStack_48._12_4_ + 1) {
      SUniformInfo::SUniformInfo((SUniformInfo *)0x352255);
      memset((void *)auStack_48._16_8_,0,(long)(int)auStack_48._24_4_);
      pSVar1 = (SUniformInfo *)auStack_48;
      paVar2 = (array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)auStack_48._16_8_;
      COpenGLExtensionHandler::extGlGetActiveUniform
                (in_stack_ffffffffffffff20,(GLuint)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (GLuint)in_stack_ffffffffffffff18,
                 (GLsizei)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                 (GLsizei *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (GLint *)auStack_48._16_8_,in_RDI,in_stack_ffffffffffffff38);
      core::string<char>::operator=
                (in_stack_ffffffffffffff18,&in_stack_ffffffffffffff10->StencilBuffer);
      auStack_48._4_4_ =
           COpenGLExtensionHandler::extGlGetUniformLocation
                     ((COpenGLExtensionHandler *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (GLuint)((ulong)paVar2 >> 0x20),(char *)pSVar1);
      core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::push_back(paVar2,pSVar1);
      SUniformInfo::~SUniformInfo((SUniformInfo *)0x352319);
    }
    if ((array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)auStack_48._16_8_ !=
        (array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)0x0) {
      operator_delete__((void *)auStack_48._16_8_);
    }
  }
  return true;
}

Assistant:

bool COpenGLSLMaterialRenderer::linkProgram()
{
	if (Program2) {
		Driver->extGlLinkProgram(Program2);

		GLint status = 0;

#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_LINK_STATUS, &status);
#endif

		if (!status) {
			os::Printer::log("GLSL (> 2.x) shader program failed to link", ELL_ERROR);
			// check error message and log it
			GLint maxLength = 0;
			GLsizei length;
#ifdef GL_VERSION_2_0
			Driver->extGlGetProgramiv(Program2, GL_INFO_LOG_LENGTH, &maxLength);
#endif
			if (maxLength) {
				GLchar *infoLog = new GLchar[maxLength];
				Driver->extGlGetProgramInfoLog(Program2, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		// get uniforms information

		GLint num = 0;
#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_ACTIVE_UNIFORMS, &num);
#endif

		if (num == 0) {
			// no uniforms
			return true;
		}

		GLint maxlen = 0;
#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_ACTIVE_UNIFORM_MAX_LENGTH, &maxlen);
#endif

		if (maxlen == 0) {
			os::Printer::log("GLSL (> 2.x): failed to retrieve uniform information", ELL_ERROR);
			return false;
		}

		// seems that some implementations use an extra null terminator
		++maxlen;
		c8 *buf = new c8[maxlen];

		UniformInfo.clear();
		UniformInfo.reallocate(num);

		for (GLint i = 0; i < num; ++i) {
			SUniformInfo ui;
			memset(buf, 0, maxlen);

			GLint size;
			Driver->extGlGetActiveUniform(Program2, i, maxlen, 0, &size, &ui.type, reinterpret_cast<GLchar *>(buf));
			ui.name = buf;
			ui.location = Driver->extGlGetUniformLocation(Program2, buf);

			UniformInfo.push_back(ui);
		}

		delete[] buf;
	} else {
		Driver->extGlLinkProgramARB(Program);

		GLint status = 0;

#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_LINK_STATUS_ARB, &status);
#endif

		if (!status) {
			os::Printer::log("GLSL shader program failed to link", ELL_ERROR);
			// check error message and log it
			GLint maxLength = 0;
			GLsizei length;
#ifdef GL_ARB_shader_objects
			Driver->extGlGetObjectParameteriv(Program,
					GL_OBJECT_INFO_LOG_LENGTH_ARB, &maxLength);
#endif
			if (maxLength) {
				GLcharARB *infoLog = new GLcharARB[maxLength];
				Driver->extGlGetInfoLog(Program, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		// get uniforms information

		GLint num = 0;
#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_ACTIVE_UNIFORMS_ARB, &num);
#endif

		if (num == 0) {
			// no uniforms
			return true;
		}

		GLint maxlen = 0;
#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_ACTIVE_UNIFORM_MAX_LENGTH_ARB, &maxlen);
#endif

		if (maxlen == 0) {
			os::Printer::log("GLSL: failed to retrieve uniform information", ELL_ERROR);
			return false;
		}

		// seems that some implementations use an extra null terminator
		++maxlen;
		c8 *buf = new c8[maxlen];

		UniformInfo.clear();
		UniformInfo.reallocate(num);

		for (int i = 0; i < num; ++i) {
			SUniformInfo ui;
			memset(buf, 0, maxlen);

			GLint size;
			Driver->extGlGetActiveUniformARB(Program, i, maxlen, 0, &size, &ui.type, reinterpret_cast<GLcharARB *>(buf));
			ui.name = buf;
			ui.location = Driver->extGlGetUniformLocationARB(Program, buf);

			UniformInfo.push_back(ui);
		}

		delete[] buf;
	}

	return true;
}